

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O2

bool __thiscall create::Serial::startReading(Serial *this)

{
  bool bVar1;
  int iVar2;
  cv_status cVar3;
  ostream *poVar4;
  uint uVar5;
  mutable_buffers_1 local_78;
  unique_lock<std::mutex> lock;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((this->port).impl_.implementation_.descriptor_ != -1) {
    if ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
      poVar4 = std::operator<<(poVar4,"data pointer not initialized.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      if (this->isReading != false) {
        return true;
      }
      lock._M_device = (mutex_type *)CONCAT44(lock._M_device._4_4_,0x80);
      sendOpcode(this,(Opcode *)&lock);
      iVar2 = (**this->_vptr_Serial)(this);
      if ((char)iVar2 != '\0') {
        boost::asio::io_context::restart(&this->io);
        local_78.super_mutable_buffer.data_ = &this->byteRead;
        local_78.super_mutable_buffer.size_ = 1;
        std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<create::Serial,void>
                  ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (__weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<create::Serial>);
        lock._M_device = (mutex_type *)onData;
        lock._M_owns = false;
        lock._9_7_ = 0;
        _Stack_50._M_pi = a_Stack_40[0]._M_pi;
        local_48 = 0;
        a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        boost::asio::
        async_read<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(create::Serial::*(std::shared_ptr<create::Serial>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long_const&)>>
                  (&this->port,&local_78,
                   (_Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
                    *)&lock,(type *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
        lock._M_device = (mutex_type *)boost::asio::io_context::run;
        lock._M_owns = false;
        lock._9_7_ = 0;
        std::thread::
        thread<std::_Bind<unsigned_long(boost::asio::io_context::*(boost::asio::io_context*))()>,,void>
                  ((thread *)&local_78,
                   (_Bind<unsigned_long_(boost::asio::io_context::*(boost::asio::io_context_*))()> *
                   )&lock);
        std::thread::operator=(&this->ioThread,(thread *)&local_78);
        std::thread::~thread((thread *)&local_78);
        std::unique_lock<std::mutex>::unique_lock(&lock,&this->dataReadyMut);
        uVar5 = 1;
        do {
          do {
            bVar1 = this->dataReady;
            if (bVar1 != false) {
              this->isReading = true;
LAB_00148f49:
              std::unique_lock<std::mutex>::~unique_lock(&lock);
              return bVar1;
            }
            local_78.super_mutable_buffer.data_ = (uint8_t *)0x1f4;
            cVar3 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                              (&this->dataReadyCond,&lock,
                               (duration<long,_std::ratio<1L,_1000L>_> *)&local_78);
          } while (cVar3 != timeout);
          if (9 < uVar5) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
            poVar4 = std::operator<<(poVar4,
                                     "failed to receive data from Create. Check if robot is powered!"
                                    );
            std::endl<char,std::char_traits<char>>(poVar4);
            boost::asio::io_context::stop(&this->io);
            std::thread::join();
            goto LAB_00148f49;
          }
          local_78.super_mutable_buffer.data_ =
               (void *)CONCAT44(local_78.super_mutable_buffer.data_._4_4_,0x80);
          sendOpcode(this,(Opcode *)&local_78);
          uVar5 = uVar5 + 1;
          (**this->_vptr_Serial)(this);
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }